

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t
XXH3_64bits_internal
          (void *input,size_t len,XXH64_hash_t seed64,void *secret,size_t secretLen,
          XXH3_hashLong64_f f_hashLong)

{
  xxh_u8 *in_RCX;
  xxh_u8 *in_RDX;
  xxh_u8 *in_RSI;
  xxh_u8 *in_RDI;
  XXH64_hash_t in_R8;
  code *in_R9;
  undefined8 local_8;
  
  if (in_RSI < (xxh_u8 *)0x11) {
    local_8 = XXH3_len_0to16_64b(in_RSI,(size_t)in_RDX,in_RCX,in_R8);
  }
  else if (in_RSI < (xxh_u8 *)0x81) {
    local_8 = XXH3_len_17to128_64b(in_RDI,(size_t)in_RSI,in_RDX,(size_t)in_RCX,in_R8);
  }
  else if (in_RSI < (xxh_u8 *)0xf1) {
    local_8 = XXH3_len_129to240_64b(in_RDI,(size_t)in_RSI,in_RDX,(size_t)in_RCX,in_R8);
  }
  else {
    local_8 = (*in_R9)(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  }
  return local_8;
}

Assistant:

XXH_FORCE_INLINE XXH64_hash_t
XXH3_64bits_internal(const void* XXH_RESTRICT input, size_t len,
                     XXH64_hash_t seed64, const void* XXH_RESTRICT secret,
                     size_t secretLen, XXH3_hashLong64_f f_hashLong) {
  XXH_ASSERT(secretLen >= XXH3_SECRET_SIZE_MIN);
  /*
   * If an action is to be taken if `secretLen` condition is not respected,
   * it should be done here.
   * For now, it's a contract pre-condition.
   * Adding a check and a branch here would cost performance at every hash.
   * Also, note that function signature doesn't offer room to return an error.
   */
  if (len <= 16)
    return XXH3_len_0to16_64b((const xxh_u8*)input, len, (const xxh_u8*)secret,
                              seed64);
  if (len <= 128)
    return XXH3_len_17to128_64b((const xxh_u8*)input, len,
                                (const xxh_u8*)secret, secretLen, seed64);
  if (len <= XXH3_MIDSIZE_MAX)
    return XXH3_len_129to240_64b((const xxh_u8*)input, len,
                                 (const xxh_u8*)secret, secretLen, seed64);
  return f_hashLong(input, len, seed64, (const xxh_u8*)secret, secretLen);
}